

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>,64ul,cs_impl::default_allocator_provider>
::alloc<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&>
          (allocator_type<cs_impl::any::holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>,64ul,cs_impl::default_allocator_provider>
           *this,shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *args)

{
  long lVar1;
  holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_> *)
              operator_new(0x18);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_> **)
               (this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>::
  holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&>
            ((holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>> *)this_00,args);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}